

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.h
# Opt level: O3

void tcg_gen_sub_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  uc_struct_conflict10 *val;
  void *pvVar1;
  uint64_t val_00;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i32 pTVar5;
  list_item *plVar6;
  uintptr_t o_3;
  uintptr_t o;
  list_item *plVar7;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGTemp *local_68;
  TCGv_i64 local_60;
  TCGv_i64 local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = tcg_ctx->uc;
  plVar7 = val->hook[0x10].head;
  if (plVar7 != (list_item *)0x0) {
    plVar6 = plVar7;
    do {
      pvVar1 = plVar6->data;
      if ((*(ulong *)((long)pvVar1 + 0x20) < *(ulong *)((long)pvVar1 + 0x18) ||
           tcg_ctx->pc_start <= *(ulong *)((long)pvVar1 + 0x20) &&
           *(ulong *)((long)pvVar1 + 0x18) <= tcg_ctx->pc_start) &&
         (*(char *)((long)pvVar1 + 0x14) == '\0')) {
        goto LAB_00d4f069;
      }
      plVar6 = plVar6->next;
    } while (plVar6 != (list_item *)0x0);
  }
  goto LAB_00d4f024;
  while( true ) {
    if (((*(char *)((long)pvVar1 + 0x14) == '\0') && (*(int *)((long)pvVar1 + 0xc) == 0)) &&
       (*(int *)((long)pvVar1 + 0x10) == 0)) {
      val_00 = tcg_ctx->pc_start;
      pTVar2 = tcg_const_i64_tricore(tcg_ctx,(int64_t)pvVar1);
      pTVar3 = tcg_const_i64_tricore(tcg_ctx,(int64_t)val);
      pTVar4 = tcg_const_i64_tricore(tcg_ctx,val_00);
      pTVar5 = tcg_const_i32_tricore(tcg_ctx,0x40);
      local_68 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_60 = arg1 + (long)&tcg_ctx->pool_cur;
      local_58 = arg2 + (long)&tcg_ctx->pool_cur;
      local_50 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
      local_48 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      tcg_gen_callN_tricore(tcg_ctx,helper_uc_traceopcode,(TCGTemp *)0x0,6,&local_68);
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    plVar7 = plVar7->next;
    if (plVar7 == (list_item *)0x0) break;
LAB_00d4f069:
    pvVar1 = plVar7->data;
    if (pvVar1 == (void *)0x0) break;
  }
LAB_00d4f024:
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_sub_i64,(TCGArg)(ret + (long)tcg_ctx),
                      (TCGArg)(arg1 + (long)tcg_ctx),(TCGArg)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void tcg_gen_sub_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
    uc_engine *uc = tcg_ctx->uc;

    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, tcg_ctx->pc_start)) {
        struct hook *hook;
        HOOK_FOREACH_VAR_DECLARE;
        HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
            if (hook->to_delete)
                continue;
            if (hook->op == UC_TCG_OP_SUB && hook->op_flags == 0) {
                gen_uc_traceopcode(tcg_ctx, hook, arg1, arg2, 64, uc, tcg_ctx->pc_start);
            }
        }
    }

    tcg_gen_op3_i64(tcg_ctx, INDEX_op_sub_i64, ret, arg1, arg2);
}